

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void entityDeclDebug(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                    xmlChar *content)

{
  long lVar1;
  undefined8 uVar2;
  xmlChar *nullstr;
  xmlEntityPtr ent;
  debugContext *ctxt;
  xmlChar *content_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  lVar1 = xmlNewEntity(0,name,type,publicId,systemId,content);
  if (systemId != (xmlChar *)0x0) {
    uVar2 = xmlBuildURI(systemId,*ctx);
    *(undefined8 *)(lVar1 + 0x78) = uVar2;
  }
  if ((type == 4) || (type == 5)) {
    xmlHashAddEntry(*(undefined8 *)((long)ctx + 0x10),name,lVar1);
  }
  else {
    xmlHashAddEntry(*(undefined8 *)((long)ctx + 8),name,lVar1);
  }
  systemId_local = publicId;
  if (publicId == (xmlChar *)0x0) {
    systemId_local = "(null)";
  }
  content_local = systemId;
  if (systemId == (xmlChar *)0x0) {
    content_local = "(null)";
  }
  ctxt = (debugContext *)content;
  if (content == (xmlChar *)0x0) {
    ctxt = (debugContext *)anon_var_dwarf_19d9;
  }
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.entityDecl(%s, %d, %s, %s, %s)\n",name,(ulong)(uint)type,
            systemId_local,content_local,ctxt);
  }
  return;
}

Assistant:

static void
entityDeclDebug(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    debugContext *ctxt = ctx;
    xmlEntityPtr ent;
    const xmlChar *nullstr = BAD_CAST "(null)";

    ent = xmlNewEntity(NULL, name, type, publicId, systemId, content);
    if (systemId != NULL)
        ent->URI = xmlBuildURI(systemId, (const xmlChar *) ctxt->filename);

    if ((type == XML_INTERNAL_PARAMETER_ENTITY) ||
        (type == XML_EXTERNAL_PARAMETER_ENTITY))
        xmlHashAddEntry(ctxt->parameterEntities, name, ent);
    else
        xmlHashAddEntry(ctxt->generalEntities, name, ent);

    /* not all libraries handle printing null pointers nicely */
    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (content == NULL)
        content = (xmlChar *)nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.entityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
}